

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_test.cpp
# Opt level: O3

void sign_verifycase::test_method<picnic_params_t_const&>(anon_enum_32 *param)

{
  ulong *puVar1;
  int frame_id;
  sign_verifycase t;
  undefined ****local_258;
  undefined1 local_250;
  undefined ***local_248;
  anon_enum_32 **local_240;
  undefined1 local_238 [16];
  undefined8 uStack_228;
  char *pcStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  ulong *puStack_c0;
  undefined8 uStack_b8;
  ulong auStack_b0 [3];
  anon_enum_32 *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined ***local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined ***local_40;
  char *local_38;
  
  local_40 = &local_70;
  local_248 = &local_90;
  local_240 = &local_98;
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00185728;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_80 = &local_50;
  local_88 = 0;
  local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_001856e8;
  local_38 = "param";
  local_90 = &PTR__lazy_ostream_001856a8;
  local_78 = " = ";
  uStack_228 = &local_258;
  local_250 = 0;
  local_258 = (undefined ****)&PTR__lazy_ostream_00185668;
  local_238._0_8_ = &PTR__lazy_ostream_00185628;
  pcStack_220 = "; ";
  local_98 = param;
  frame_id = boost::unit_test::framework::add_context((lazy_ostream *)local_238,true);
  uStack_b8 = 0;
  auStack_b0[0] = 0;
  auStack_b0[1] = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  puStack_c0 = (ulong *)0x0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  local_238._0_8_ = (_func_int **)0x0;
  local_238._8_8_ = 0;
  uStack_228 = (undefined *****)0x0;
  pcStack_220 = (char *)0x0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  uStack_b8 = 0;
  auStack_b0[0] = auStack_b0[0] & 0xffffffffffffff00;
  local_258 = (undefined ****)CONCAT71(local_258._1_7_,0x22);
  puStack_c0 = auStack_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"sign_verify",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_c0,(string *)&local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  puVar1 = puStack_c0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x18;
  if (puStack_c0 != auStack_b0) {
    operator_delete(puStack_c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)&uStack_1c8);
  uStack_b8 = 0;
  auStack_b0[0] = 0;
  auStack_b0[1] = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  puStack_c0 = (ulong *)0x0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  local_238._0_8_ = (_func_int **)0x0;
  local_238._8_8_ = 0;
  uStack_228 = (undefined *****)0x0;
  pcStack_220 = (char *)0x0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  uStack_b8 = 0;
  auStack_b0[0] = auStack_b0[0] & 0xffffffffffffff00;
  local_258 = (undefined ****)CONCAT71(local_258._1_7_,0x22);
  puStack_c0 = auStack_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"sign_verify",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_c0,(string *)&local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  puVar1 = puStack_c0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x18;
  if (puStack_c0 != auStack_b0) {
    operator_delete(puStack_c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)&uStack_1c8);
  uStack_b8 = 0;
  auStack_b0[0] = 0;
  auStack_b0[1] = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  puStack_c0 = (ulong *)0x0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  local_238._0_8_ = (_func_int **)0x0;
  local_238._8_8_ = 0;
  uStack_228 = (undefined *****)0x0;
  pcStack_220 = (char *)0x0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  uStack_b8 = 0;
  auStack_b0[0] = auStack_b0[0] & 0xffffffffffffff00;
  local_258 = (undefined ****)CONCAT71(local_258._1_7_,0x22);
  puStack_c0 = auStack_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"sign_verify",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_c0,(string *)&local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  puVar1 = puStack_c0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x18;
  if (puStack_c0 != auStack_b0) {
    operator_delete(puStack_c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)&uStack_1c8);
  _impl<picnic_params_t>((sign_verifycase *)&local_90,param);
  uStack_b8 = 0;
  auStack_b0[0] = 0;
  auStack_b0[1] = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  puStack_c0 = (ulong *)0x0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  local_238._0_8_ = (_func_int **)0x0;
  local_238._8_8_ = 0;
  uStack_228 = (undefined *****)0x0;
  pcStack_220 = (char *)0x0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  uStack_b8 = 0;
  auStack_b0[0] = auStack_b0[0] & 0xffffffffffffff00;
  local_258 = (undefined ****)CONCAT71(local_258._1_7_,0x22);
  puStack_c0 = auStack_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"sign_verify",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_c0,(string *)&local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  puVar1 = puStack_c0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x18;
  if (puStack_c0 != auStack_b0) {
    operator_delete(puStack_c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)&uStack_1c8);
  uStack_b8 = 0;
  auStack_b0[0] = 0;
  auStack_b0[1] = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  puStack_c0 = (ulong *)0x0;
  local_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  uStack_188 = 0;
  uStack_180 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  local_238._0_8_ = (_func_int **)0x0;
  local_238._8_8_ = 0;
  uStack_228 = (undefined *****)0x0;
  pcStack_220 = (char *)0x0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  uStack_b8 = 0;
  auStack_b0[0] = auStack_b0[0] & 0xffffffffffffff00;
  local_258 = (undefined ****)CONCAT71(local_258._1_7_,0x22);
  puStack_c0 = auStack_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"sign_verify",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_c0,(string *)&local_258);
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  puVar1 = puStack_c0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x18;
  if (puStack_c0 != auStack_b0) {
    operator_delete(puStack_c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)&uStack_1c8);
  boost::unit_test::framework::clear_context(frame_id);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(sign_verify, all_supported_parameters(), param) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(param)) {
    const size_t max_signature_size = picnic_signature_size(param);
    BOOST_TEST(max_signature_size);

    std::array<uint8_t, 32> m;
    randomize_container(m);

    // Create a key pair
    picnic_privatekey_t private_key;
    picnic_publickey_t public_key;
    BOOST_TEST(!picnic_keygen(param, &public_key, &private_key));

    // Valid key pair
    BOOST_TEST(picnic_get_public_key_param(&public_key) == param);
    BOOST_TEST(picnic_get_private_key_param(&private_key) == param);
    BOOST_TEST(!picnic_validate_keypair(&private_key, &public_key));

    std::vector<uint8_t> sig;
    sig.resize(max_signature_size);
    size_t siglen = max_signature_size;

    // Sign a message
    BOOST_TEST(!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen));
    BOOST_TEST(siglen > 0);
    BOOST_TEST(siglen <= max_signature_size);
    // Verify signature
    BOOST_TEST(!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen));
  }
}